

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ac3StreamReader.h
# Opt level: O0

void __thiscall AC3StreamReader::AC3StreamReader(AC3StreamReader *this)

{
  AC3StreamReader *this_local;
  
  SimplePacketizerReader::SimplePacketizerReader(&this->super_SimplePacketizerReader);
  AC3Codec::AC3Codec(&this->super_AC3Codec);
  (this->super_SimplePacketizerReader).super_AbstractStreamReader.super_BaseAbstractStreamReader.
  _vptr_BaseAbstractStreamReader = (_func_int **)&PTR__AC3StreamReader_0043fea8;
  (this->super_AC3Codec)._vptr_AC3Codec = (_func_int **)&PTR__AC3StreamReader_0043ffc0;
  this->m_useNewStyleAudioPES = false;
  MemoryBlock::MemoryBlock(&this->m_delayedAc3Buffer);
  AVPacket::AVPacket(&this->m_delayedAc3Packet);
  (this->super_AC3Codec).m_true_hd_mode = false;
  (this->super_AC3Codec).m_downconvertToAC3 = false;
  (this->super_AC3Codec).m_state = stateDecodeAC3;
  (this->super_AC3Codec).m_waitMoreData = false;
  this->m_thdDemuxWaitAc3 = true;
  this->m_demuxedTHDSamples = 0;
  this->m_totalTHDSamples = 0;
  this->m_nextAc3Time = 0;
  return;
}

Assistant:

AC3StreamReader() : m_useNewStyleAudioPES(false)
    {
        m_downconvertToAC3 = m_true_hd_mode = false;
        m_state = AC3State::stateDecodeAC3;
        m_waitMoreData = false;

        m_thdDemuxWaitAc3 = true;  // wait ac3 packet
        m_demuxedTHDSamples = 0;
        m_totalTHDSamples = 0;
        m_nextAc3Time = 0;
    }